

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

Clifford * operator^(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  pointer *ppBVar1;
  uint uVar2;
  uint uVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  iterator __position;
  float *pfVar7;
  pointer pBVar8;
  pointer pBVar9;
  long lVar10;
  float fVar11;
  Blade local_30;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (long)dim) {
    memset(Re,0,(long)dim << 2);
  }
  pBVar8 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar4 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pBVar8 != pBVar4) {
    pBVar5 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar6 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    do {
      pfVar7 = Re;
      if (pBVar5 != pBVar6) {
        uVar2 = pBVar8->mBase;
        pBVar9 = pBVar5;
        do {
          uVar3 = pBVar9->mBase;
          if (((uVar3 & uVar2) == 0) && (fVar11 = pBVar8->mVal * pBVar9->mVal, 1e-06 < ABS(fVar11)))
          {
            pfVar7[(int)(uVar3 ^ uVar2)] =
                 (float)signs[(int)uVar2][(int)uVar3] * fVar11 + pfVar7[(int)(uVar3 ^ uVar2)];
          }
          pBVar9 = pBVar9 + 1;
        } while (pBVar9 != pBVar6);
      }
      pBVar8 = pBVar8 + 1;
    } while (pBVar8 != pBVar4);
  }
  if (0 < dim) {
    lVar10 = 0;
    do {
      if (1e-06 < ABS(Re[lVar10])) {
        Blade::Blade(&local_30,(int)lVar10,Re[lVar10]);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,__position,&local_30);
        }
        else {
          *__position._M_current = local_30;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_30);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < dim);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator^(Clifford A, Clifford B)
{
   Clifford R; 
   //double *Re=new double[dim];
   for(int i=0;i<dim;i++)Re[i]=0;


   idx a=A.begin();
	while(a!=A.end())
	{
		int am=a->mBase;
		idx b=B.begin();
		while(b!=B.end())
		{	
			int bm=b->mBase;
			
			if((am&bm)==0)
			{
				float prd=(a->mVal)*(b->mVal);
				if(fabs(prd)>Error2)
					Re[am^bm]+=signs[am][bm]*prd;

			}
			b++;
		}
		a++;
	}

	for(int i=0;i<dim;i++)
	{if(fabs(Re[i])>Error2){R.push_back(Blade(i,Re[i]));}}
  //delete Re;
  return R;
}